

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void __thiscall tinyxml2::MemPoolT<96>::Clear(MemPoolT<96> *this)

{
  Block *pBVar1;
  int iVar2;
  
  iVar2 = (this->_blockPtrs)._size;
  while (iVar2 != 0) {
    (this->_blockPtrs)._size = iVar2 + -1;
    pBVar1 = (this->_blockPtrs)._mem[(long)iVar2 + -1];
    if (pBVar1 != (Block *)0x0) {
      operator_delete(pBVar1);
    }
    iVar2 = (this->_blockPtrs)._size;
  }
  this->_root = (Chunk *)0x0;
  this->_currentAllocs = 0;
  this->_nAllocs = 0;
  this->_maxAllocs = 0;
  this->_nUntracked = 0;
  return;
}

Assistant:

void Clear() {
        // Delete the blocks.
        while( !_blockPtrs.Empty()) {
            Block* b  = _blockPtrs.Pop();
            delete b;
        }
        _root = 0;
        _currentAllocs = 0;
        _nAllocs = 0;
        _maxAllocs = 0;
        _nUntracked = 0;
    }